

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int select_detect(jit_State *J)

{
  uint uVar1;
  TRef TVar2;
  TRef TVar3;
  TValue *pTVar4;
  IRRef1 local_4c;
  TRef kfunc;
  cTValue *func;
  BCIns ins;
  jit_State *J_local;
  
  uVar1 = J->pc[1];
  if (((((uVar1 & 0xff) == 0x41) && (uVar1 >> 0x18 == 2)) && ((uVar1 >> 0x10 & 0xff) == 1)) &&
     ((pTVar4 = J->L->base + (uVar1 >> 8 & 0xff), (int)(pTVar4->field_4).it >> 0xf == -9 &&
      (*(char *)((pTVar4->u64 & 0x7fffffffffff) + 10) == '\x10')))) {
    TVar2 = lj_ir_kgc(J,(GCobj *)(pTVar4->u64 & 0x7fffffffffff),IRT_FUNC);
    if (J->base[uVar1 >> 8 & 0xff] == 0) {
      TVar3 = sload(J,uVar1 >> 8 & 0xff);
      local_4c = (IRRef1)TVar3;
    }
    else {
      local_4c = (IRRef1)J->base[uVar1 >> 8 & 0xff];
    }
    (J->fold).ins.field_0.ot = 0x888;
    (J->fold).ins.field_0.op1 = local_4c;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
    J_local._4_4_ = 1;
  }
  else {
    J_local._4_4_ = 0;
  }
  return J_local._4_4_;
}

Assistant:

static int select_detect(jit_State *J)
{
  BCIns ins = J->pc[1];
  if (bc_op(ins) == BC_CALLM && bc_b(ins) == 2 && bc_c(ins) == 1) {
    cTValue *func = &J->L->base[bc_a(ins)];
    if (tvisfunc(func) && funcV(func)->c.ffid == FF_select) {
      TRef kfunc = lj_ir_kfunc(J, funcV(func));
      emitir(IRTG(IR_EQ, IRT_FUNC), getslot(J, bc_a(ins)), kfunc);
      return 1;
    }
  }
  return 0;
}